

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_set_version(exr_context_t ctxt,int part_index,int32_t val)

{
  long lVar1;
  exr_result_t eVar2;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  exr_priv_part_t part;
  int32_t in_stack_00000010;
  exr_result_t rv;
  exr_attribute_t *attr;
  exr_attribute_t **in_stack_00000040;
  exr_const_context_t_conflict in_stack_ffffffffffffffd0;
  exr_const_context_t_conflict c;
  int local_24;
  exr_result_t local_4;
  
  if ((in_EDX < 1) || (1 < in_EDX)) {
    local_4 = 4;
  }
  else {
    local_24 = 0;
    if (in_RDI == (char *)0x0) {
      local_4 = 2;
    }
    else {
      internal_exr_lock(in_stack_ffffffffffffffd0);
      if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
        internal_exr_unlock(in_stack_ffffffffffffffd0);
        local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
      }
      else {
        c = *(exr_const_context_t_conflict *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
        if (*in_RDI == '\0') {
          internal_exr_unlock(c);
          local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
        }
        else if (*in_RDI == '\x03') {
          internal_exr_unlock(c);
          local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
        }
        else {
          lVar1._0_4_ = c->default_zip_level;
          lVar1._4_4_ = c->default_dwa_quality;
          if (lVar1 == 0) {
            local_24 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)CONCAT44(part_index,val),
                                         (char *)attr,rv,in_stack_00000010,(uint8_t **)part,
                                         in_stack_00000040);
          }
          else if (*(int *)(*(long *)&c->default_zip_level + 0x14) != 10) {
            internal_exr_unlock(c);
            eVar2 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                               *(undefined8 *)(*(long *)&c->default_zip_level + 8),"version");
            return eVar2;
          }
          if (local_24 == 0) {
            *(int *)(*(long *)&c->default_zip_level + 0x18) = in_EDX;
          }
          internal_exr_unlock(c);
          local_4 = local_24;
        }
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_set_version (exr_context_t ctxt, int part_index, int32_t val)
{
    /* version number for deep data, expect 1 */
    if (val <= 0 || val > 1) return EXR_ERR_ARGUMENT_OUT_OF_RANGE;

    {
        REQ_ATTR_FIND_CREATE (version, EXR_ATTR_INT);
        if (rv == EXR_ERR_SUCCESS) { attr->i = val; }
        return EXR_UNLOCK_AND_RETURN (rv);
    }
}